

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

void __thiscall
Pathie::Path::Path(Path *this,vector<Pathie::Path,_std::allocator<Pathie::Path>_> *components)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  (this->m_path)._M_dataplus._M_p = (pointer)&(this->m_path).field_2;
  (this->m_path)._M_string_length = 0;
  (this->m_path).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  __lhs = &((components->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
            super__Vector_impl_data._M_start)->m_path;
  if (0x20 < (ulong)((long)(components->
                           super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)__lhs)) {
    if (*(this->m_path)._M_dataplus._M_p != '/') {
      std::__cxx11::string::append((char *)this);
      __lhs = &((components->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>).
                _M_impl.super__Vector_impl_data._M_start)->m_path;
    }
    while (__lhs = __lhs + 1,
          __lhs != &((components->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>).
                     _M_impl.super__Vector_impl_data._M_finish)->m_path) {
      std::operator+(&bStack_48,__lhs,"/");
      std::__cxx11::string::append((string *)this);
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::substr((ulong)&bStack_48,(ulong)this);
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

Path::Path(const std::vector<Path>& components)
{
  m_path = components.front().m_path;

  if (components.size() > 1) {
    // Ensure that for both absolute and relative path we end in
    // a slash for appending below
    if (m_path[0] != '/') {
      m_path += "/";
    }

    std::vector<Path>::const_iterator iter;
    for(iter=components.begin()+1; iter != components.end(); iter++) { // first element has already been taken care of above
      m_path += (*iter).m_path + "/";
    }

    // Trailing slash is unwanted, remove it
    m_path = m_path.substr(0, m_path.length()-1);
  }
}